

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::internal::RepeatedFieldAccessor::Get<std::__cxx11::string>
          (RepeatedFieldAccessor *this,Field *data,int index)

{
  string *psVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  long *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ActualType scratch_space;
  string local_40 [36];
  undefined4 local_1c;
  undefined8 local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::__cxx11::string::string(local_40);
  psVar1 = (string *)(**(code **)(*in_RSI + 0x10))(in_RSI,local_18,local_1c,local_40);
  std::__cxx11::string::string((string *)in_RDI,psVar1);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

T Get(const Field* data, int index) const {
    typedef typename RefTypeTraits<T>::AccessorValueType ActualType;
    ActualType scratch_space;
    return static_cast<T>(*reinterpret_cast<const ActualType*>(
        Get(data, index, static_cast<Value*>(&scratch_space))));
  }